

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O2

void __thiscall
ExecutionEngine::startExecutionEngine(ExecutionEngine *this,ClassRuntime *classRuntime)

{
  bool bVar1;
  uint32_t uVar2;
  VMStack *this_00;
  anon_union_8_10_52016fac_for_data this_01;
  Frame *pFVar3;
  byte *pbVar4;
  code *pcVar5;
  ExecutionEngine *this_02;
  allocator local_14a;
  allocator local_149;
  vector<Value,_std::allocator<Value>_> arguments;
  _Vector_base<Value,_std::allocator<Value>_> local_128;
  _Vector_base<Value,_std::allocator<Value>_> local_110;
  string local_f8;
  string local_d8;
  undefined1 local_b8 [32];
  string local_98;
  string local_78;
  string local_58;
  Value commandLineArgs;
  
  this_00 = VMStack::getInstance();
  arguments.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  arguments.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  arguments.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  commandLineArgs.type = REFERENCE;
  this_01.object = (Object *)operator_new(0x28);
  ArrayObject::ArrayObject((ArrayObject *)this_01.object,REFERENCE);
  commandLineArgs.data.object = this_01.object;
  std::vector<Value,_std::allocator<Value>_>::push_back(&arguments,&commandLineArgs);
  pFVar3 = (Frame *)operator_new(0xb8);
  std::__cxx11::string::string((string *)&local_58,"main",&local_149);
  std::__cxx11::string::string((string *)&local_78,"([Ljava/lang/String;)V",&local_14a);
  std::vector<Value,_std::allocator<Value>_>::vector
            ((vector<Value,_std::allocator<Value>_> *)&local_110,&arguments);
  Frame::Frame(pFVar3,classRuntime,&local_58,&local_78,
               (vector<Value,_std::allocator<Value>_> *)&local_110);
  VMStack::addFrame(this_00,pFVar3);
  std::_Vector_base<Value,_std::allocator<Value>_>::~_Vector_base(&local_110);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string((string *)(local_b8 + 0x20),"<clinit>",&local_149);
  this_02 = (ExecutionEngine *)local_b8;
  std::__cxx11::string::string((string *)this_02,"()V",&local_14a);
  bVar1 = doesMethodExist(this_02,classRuntime,(string *)(local_b8 + 0x20),(string *)local_b8);
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::string::~string((string *)(local_b8 + 0x20));
  if (bVar1) {
    pFVar3 = (Frame *)operator_new(0xb8);
    std::__cxx11::string::string((string *)&local_d8,"<clinit>",&local_149);
    std::__cxx11::string::string((string *)&local_f8,"()V",&local_14a);
    std::vector<Value,_std::allocator<Value>_>::vector
              ((vector<Value,_std::allocator<Value>_> *)&local_128,&arguments);
    Frame::Frame(pFVar3,classRuntime,&local_d8,&local_f8,
                 (vector<Value,_std::allocator<Value>_> *)&local_128);
    VMStack::addFrame(this_00,pFVar3);
    std::_Vector_base<Value,_std::allocator<Value>_>::~_Vector_base(&local_128);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_d8);
  }
  while (uVar2 = VMStack::size(this_00), uVar2 != 0) {
    pFVar3 = VMStack::getTopFrame(this_00);
    pbVar4 = Frame::getCode(pFVar3,pFVar3->pc);
    pcVar5 = (code *)this->_instructionFunctions[(ulong)*pbVar4 * 2];
    if (((ulong)pcVar5 & 1) != 0) {
      pcVar5 = *(code **)(pcVar5 + *(long *)((long)this->_instructionFunctions +
                                            (this->_instructionFunctions[(ulong)*pbVar4 * 2 + 1] - 8
                                            )) + -1);
    }
    (*pcVar5)();
  }
  std::_Vector_base<Value,_std::allocator<Value>_>::~_Vector_base
            (&arguments.super__Vector_base<Value,_std::allocator<Value>_>);
  return;
}

Assistant:

void ExecutionEngine::startExecutionEngine(ClassRuntime *classRuntime) {
    VMStack &stackFrame = VMStack::getInstance();

    vector<Value> arguments;
    Value commandLineArgs;
    commandLineArgs.type = ValueType::REFERENCE;
    commandLineArgs.data.object = new ArrayObject(ValueType::REFERENCE);
    arguments.push_back(commandLineArgs);

    stackFrame.addFrame(new Frame(classRuntime, "main", "([Ljava/lang/String;)V", arguments));

    if (doesMethodExist(classRuntime, "<clinit>", "()V")) {
        stackFrame.addFrame(new Frame(classRuntime, "<clinit>", "()V", arguments));
    }

    while (stackFrame.size() > 0) {
        Frame *topFrame = stackFrame.getTopFrame();
        u1 *code = topFrame->getCode(topFrame->pc);
        (*this.*_instructionFunctions[code[0]])();
    }
}